

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

void Assimp::ConvertListToStrings
               (string *in,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  size_t *psVar1;
  byte bVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar3;
  byte *pbVar4;
  ulong uVar5;
  Logger *this;
  _List_node_base *p_Var6;
  byte *pbVar7;
  byte *pbVar8;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _List_node_base local_48;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar8 = (byte *)(in->_M_dataplus)._M_p;
  if (*pbVar8 != 0) {
    local_38 = out;
LAB_00140260:
    do {
      uVar5 = (ulong)*pbVar8;
      if (uVar5 < 0x28) {
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0) {
          pbVar8 = pbVar8 + 1;
          goto LAB_00140260;
        }
        if (uVar5 != 0x27) goto LAB_001402c5;
        pbVar4 = pbVar8 + 2;
        do {
          pbVar7 = pbVar4;
          bVar2 = pbVar7[-1];
          if (bVar2 == 0x27) {
            local_58 = &local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,pbVar8 + 1,pbVar7 + -1);
            p_Var6 = (_List_node_base *)operator_new(0x30);
            plVar3 = local_38;
            p_Var6[1]._M_next = p_Var6 + 2;
            if (local_58 == &local_48) {
              p_Var6[2]._M_next =
                   (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
              p_Var6[2]._M_prev = local_48._M_prev;
            }
            else {
              p_Var6[1]._M_next = local_58;
              p_Var6[2]._M_next =
                   (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
            }
            p_Var6[1]._M_prev = local_50;
            local_50 = (_List_node_base *)0x0;
            local_48._M_next._0_1_ = 0;
            local_58 = &local_48;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar1 = &(plVar3->
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            if (local_58 != &local_48) {
              operator_delete(local_58);
            }
            goto LAB_001403f5;
          }
          pbVar4 = pbVar7 + 1;
        } while (*pbVar7 != 0);
        this = DefaultLogger::get();
        Logger::error(this,"ConvertListToString: String list is ill-formatted");
LAB_001403f5:
        if (bVar2 != 0x27) {
          return;
        }
      }
      else {
LAB_001402c5:
        while ((pbVar7 = pbVar8, (ulong)*pbVar8 < 0x21 &&
               ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
          pbVar8 = pbVar8 + 1;
        }
        while ((0x20 < (ulong)*pbVar7 || ((0x100003601U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))) {
          pbVar7 = pbVar7 + 1;
        }
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pbVar8,pbVar7);
        p_Var6 = (_List_node_base *)operator_new(0x30);
        plVar3 = local_38;
        p_Var6[1]._M_next = p_Var6 + 2;
        if (local_58 == &local_48) {
          p_Var6[2]._M_next =
               (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
          p_Var6[2]._M_prev = local_48._M_prev;
        }
        else {
          p_Var6[1]._M_next = local_58;
          p_Var6[2]._M_next =
               (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
        }
        p_Var6[1]._M_prev = local_50;
        local_50 = (_List_node_base *)0x0;
        local_48._M_next._0_1_ = 0;
        local_58 = &local_48;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(plVar3->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_58 != &local_48) {
          operator_delete(local_58);
        }
      }
      pbVar8 = pbVar7;
    } while (*pbVar7 != 0);
  }
  return;
}

Assistant:

void ConvertListToStrings(const std::string& in, std::list<std::string>& out)
{
    const char* s = in.c_str();
    while (*s) {
        SkipSpacesAndLineEnd(&s);
        if (*s == '\'') {
            const char* base = ++s;
            while (*s != '\'') {
                ++s;
                if (*s == '\0') {
                    ASSIMP_LOG_ERROR("ConvertListToString: String list is ill-formatted");
                    return;
                }
            }
            out.push_back(std::string(base,(size_t)(s-base)));
            ++s;
        }
        else {
            out.push_back(GetNextToken(s));
        }
    }
}